

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  int iVar1;
  double *pdVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  Scal *pSVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  Z aux;
  Vec T;
  Vec sumWsq;
  double local_f0;
  double local_e8;
  plain_array<double,_1,_0,_0> local_e0;
  void *local_d8 [2];
  void *local_c8 [2];
  double local_b8;
  int *local_b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_a8;
  
  local_a8.m_lhs.m_lhs = (LhsNested)(long)this->nInvSolFound;
  local_a8.m_rhs._0_8_ = 0;
  local_b0 = newSol2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_d8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_a8);
  local_a8.m_lhs.m_lhs = (LhsNested)(long)this->nInvSolFound;
  local_a8.m_rhs._0_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_a8);
  pdVar2 = (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  piVar3 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->M;
  if (this->M < 1) {
    uVar5 = uVar6;
  }
  pSVar7 = &(((this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).p_x_Norm;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    lVar8 = (long)piVar3[uVar6];
    *(double *)((long)local_d8[0] + lVar8 * 8) =
         pdVar2[uVar6] + *(double *)((long)local_d8[0] + lVar8 * 8);
    *(double *)((long)local_c8[0] + lVar8 * 8) =
         *pSVar7 * *pSVar7 + *(double *)((long)local_c8[0] + lVar8 * 8);
    pSVar7 = pSVar7 + 0x35;
  }
  *worseSol = -1;
  lVar9 = 0;
  local_e8 = -1.0;
  for (lVar8 = 0; lVar8 < this->nInvSolFound; lVar8 = lVar8 + 1) {
    dVar11 = *(double *)((long)local_d8[0] + lVar8 * 8) -
             (double)(this->invPredictions).
                     super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     .
                     super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8].
                     super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
             (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data
             [(this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows * lVar8];
    *(double *)((long)local_d8[0] + lVar8 * 8) = dVar11;
    dVar11 = dVar11 / this->sumAll;
    *(double *)((long)local_d8[0] + lVar8 * 8) = dVar11;
    dVar10 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data[lVar8];
    dVar10 = (dVar10 * dVar10) / *(double *)((long)local_c8[0] + lVar8 * 8) + -1.0 + 1.0;
    if ((1.0 <= dVar10) && (0.0 < dVar11)) {
      boost::math::
      chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::chi_squared_distribution
                ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                  *)&local_a8,dVar10);
      dVar10 = boost::math::
               cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                         ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                           *)&local_a8,(double *)((long)local_d8[0] + lVar9));
      if (local_e8 <= dVar10) {
        *worseSol = (int)lVar8;
        local_e8 = dVar10;
      }
    }
    lVar9 = lVar9 + 8;
  }
  local_b8 = (this->param).multiValuedSignificance;
  if (local_b8 < local_e8) {
    local_f0 = -1.0;
    for (lVar8 = 0; uVar5 = (ulong)this->M, lVar8 < (long)uVar5; lVar8 = lVar8 + 1) {
      iVar1 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (iVar1 == *worseSol) {
        local_a8.m_lhs.m_lhs =
             (this->iInvRj).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8;
        local_a8.m_lhs.m_rhs =
             (this->invPredictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar1;
        local_a8.m_rhs.m_lhs.m_rows.m_value =
             (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data + local_a8.m_rhs.m_lhs.m_rows.m_value * lVar8;
        local_a8.m_rhs.m_lhs.m_functor.m_other = 2.0;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = 0;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = local_a8.m_rhs.m_lhs.m_rows.m_value;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             &this->invRzj;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = lVar8;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride = local_a8.m_rhs.m_lhs.m_rows.m_value;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
                  ((Matrix<double,_1,_1,_0,_1,_1> *)&local_e0,&local_a8);
        dVar10 = (double)(this->invPredictions).
                         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         .
                         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[*worseSol].
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                 (double)local_e0.array[0] +
                 (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar8];
        if (local_f0 < dVar10) {
          *newSol1 = (int)lVar8;
          local_f0 = dVar10;
        }
      }
    }
    local_f0 = -1.0;
    for (lVar8 = 0; lVar8 < (int)uVar5; lVar8 = lVar8 + 1) {
      if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] == *worseSol) {
        local_a8.m_lhs.m_lhs =
             (this->iInvRj).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar8;
        local_a8.m_rhs.m_lhs.m_rows.m_value =
             (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_a8.m_lhs.m_rhs =
             &(this->experts).
              super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              .
              super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[*newSol1].super_LinearExpert<1,_1>.pred_z;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data + local_a8.m_rhs.m_lhs.m_rows.m_value * lVar8;
        local_a8.m_rhs.m_lhs.m_functor.m_other = 2.0;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = 0;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows
        .m_value = local_a8.m_rhs.m_lhs.m_rows.m_value;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             &this->invRzj;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = lVar8;
        local_a8.m_rhs.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride = local_a8.m_rhs.m_lhs.m_rows.m_value;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
                  ((Matrix<double,_1,_1,_0,_1,_1> *)&local_e0,&local_a8);
        dVar10 = (double)(this->experts).
                         super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                         .
                         super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[*newSol1].
                         super_LinearExpert<1,_1>.pred_z.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                 (double)local_e0.array[0] +
                 (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar8];
        if (local_f0 < dVar10) {
          *local_b0 = (int)lVar8;
          local_f0 = dVar10;
        }
      }
      uVar5 = (ulong)(uint)this->M;
    }
  }
  bVar4 = local_e8 <= local_b8;
  free(local_c8[0]);
  free(local_d8[0]);
  return bVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validInverseSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    Vec T = Vec::Zero(nInvSolFound);
    Vec sumWsq = Vec::Zero(nInvSolFound);
    for(int j = 0; j < M; j++)
    {
        T(sNearestInv[j]) += zInvRzj(j);
        sumWsq(sNearestInv[j]) += experts[j].get_p_x()*experts[j].get_p_x();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;
    for(int k = 0; k < nInvSolFound; k++)
    {
        T(k) -= invPredictions[k].dot( sumInvRzj.col(k) );
        T(k) /= (sumAll);

        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k) - 1.0) * d;
//        Scal dof = (sum_p_x(k) * sum_p_x(k) / sumWsq(k)) * d;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dist, dMax = -1.0;
        Z aux;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * invPredictions[worseSol] - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + invPredictions[worseSol].dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol1 = j;
            }
        }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        for(int j = 0; j < M; j++)
        {
            if (sNearestInv[j] != worseSol)
                continue;

            aux = iInvRj[j] * experts[newSol1].getPredZ() - 2.0 * invRzj.col(j);
            dist = zInvRzj(j) + experts[newSol1].getPredZ().dot( aux );

            if( dist > dMax )
            {
                dMax = dist;
                newSol2 = j;
            }
        }

        return false;
    }
}